

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall
cfd::core::ScriptOperator::ScriptOperator(ScriptOperator *this,ScriptType data_type,string *text)

{
  bool bVar1;
  ulong uVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>,_bool>
  pVar3;
  _Self local_80;
  _Self local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  _Self local_60;
  _Self local_58 [3];
  string local_40;
  string *local_20;
  string *text_local;
  ScriptOperator *pSStack_10;
  ScriptType data_type_local;
  ScriptOperator *this_local;
  
  this->_vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_0088b7f8;
  this->data_type_ = data_type;
  local_20 = text;
  text_local._4_4_ = data_type;
  pSStack_10 = this;
  ::std::__cxx11::string::string((string *)&this->text_data_,(string *)text);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_58[0]._M_node =
         (_Base_ptr)
         ::std::
         map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
         ::find((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                 *)g_operator_map,&this->data_type_);
    local_60._M_node =
         (_Base_ptr)
         ::std::
         map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
         ::end((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                *)g_operator_map);
    bVar1 = ::std::operator==(local_58,&local_60);
    if (bVar1) {
      pVar3 = ::std::
              map<cfd::core::ScriptType,cfd::core::ScriptOperator,std::less<cfd::core::ScriptType>,std::allocator<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>>
              ::emplace<cfd::core::ScriptType&,cfd::core::ScriptOperator&>
                        ((map<cfd::core::ScriptType,cfd::core::ScriptOperator,std::less<cfd::core::ScriptType>,std::allocator<std::pair<cfd::core::ScriptType_const,cfd::core::ScriptOperator>>>
                          *)g_operator_map,&this->data_type_,this);
      local_70 = (_Base_ptr)pVar3.first._M_node;
      local_68 = pVar3.second;
    }
    local_78._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                 *)g_operator_text_map_abi_cxx11_,&this->text_data_);
    local_80._M_node =
         (_Base_ptr)
         ::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                *)g_operator_text_map_abi_cxx11_);
    bVar1 = ::std::operator==(&local_78,&local_80);
    if (bVar1) {
      ::std::
      map<std::__cxx11::string,cfd::core::ScriptOperator,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>>
      ::emplace<std::__cxx11::string&,cfd::core::ScriptOperator&>
                ((map<std::__cxx11::string,cfd::core::ScriptOperator,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::ScriptOperator>>>
                  *)g_operator_text_map_abi_cxx11_,&this->text_data_,this);
    }
  }
  else {
    bVar1 = ::std::
            map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
            ::empty((map<cfd::core::ScriptType,_cfd::core::ScriptOperator,_std::less<cfd::core::ScriptType>,_std::allocator<std::pair<const_cfd::core::ScriptType,_cfd::core::ScriptOperator>_>_>
                     *)g_operator_map);
    if (!bVar1) {
      ToString_abi_cxx11_(&local_40,this);
      ::std::__cxx11::string::operator=((string *)&this->text_data_,(string *)&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

ScriptOperator::ScriptOperator(ScriptType data_type, const std::string& text)
    : data_type_(data_type), text_data_(text) {
  // map register the const definition at production timing
  if (text.empty()) {
    if (!g_operator_map.empty()) {
      text_data_ = ToString();
    }
  } else {
    if (g_operator_map.find(data_type_) == g_operator_map.end()) {
      g_operator_map.emplace(data_type_, *this);
    }
    if (g_operator_text_map.find(text_data_) == g_operator_text_map.end()) {
      g_operator_text_map.emplace(text_data_, *this);
    }
  }
}